

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm1394.cpp
# Opt level: O2

int GetMenuChoice(AmpIO *Board,string *mcsName)

{
  size_type sVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  char *pcVar7;
  termios savedTerm;
  termios newTerm;
  string local_d8;
  termios local_b4;
  termios local_78;
  
  iVar4 = 0;
  tcgetattr(0,&local_b4);
  local_78.c_iflag = local_b4.c_iflag;
  local_78.c_oflag = local_b4.c_oflag;
  local_78.c_line = local_b4.c_line;
  local_78.c_cc[0] = local_b4.c_cc[0];
  local_78.c_cc[1] = local_b4.c_cc[1];
  local_78.c_cc[2] = local_b4.c_cc[2];
  local_78.c_cc[3] = local_b4.c_cc[3];
  local_78.c_cc[4] = local_b4.c_cc[4];
  local_78.c_cc[5] = local_b4.c_cc[5];
  local_78.c_cc[6] = local_b4.c_cc[6];
  local_78.c_cc[7] = local_b4.c_cc[7];
  local_78.c_cc[8] = local_b4.c_cc[8];
  local_78.c_cc[9] = local_b4.c_cc[9];
  local_78.c_cc[10] = local_b4.c_cc[10];
  local_78.c_cc[0xb] = local_b4.c_cc[0xb];
  local_78.c_cc[0xc] = local_b4.c_cc[0xc];
  local_78.c_cc[0xd] = local_b4.c_cc[0xd];
  local_78.c_cc[0xe] = local_b4.c_cc[0xe];
  local_78.c_cc[0xf] = local_b4.c_cc[0xf];
  local_78.c_cc[0x10] = local_b4.c_cc[0x10];
  local_78.c_cc[0x11] = local_b4.c_cc[0x11];
  local_78.c_cc[0x12] = local_b4.c_cc[0x12];
  local_78.c_cc[0x13] = local_b4.c_cc[0x13];
  local_78.c_cc[0x14] = local_b4.c_cc[0x14];
  local_78.c_cc[0x15] = local_b4.c_cc[0x15];
  local_78.c_cc[0x16] = local_b4.c_cc[0x16];
  local_78.c_ispeed = local_b4.c_ispeed;
  local_78.c_ospeed = local_b4.c_ospeed;
  local_78._8_8_ = local_b4._8_8_ & 0xfffffffdffffffff;
  tcsetattr(0,0,&local_78);
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  uVar3 = BoardIO::GetHardwareVersion((BoardIO *)Board);
  sVar1 = mcsName->_M_string_length;
  pcVar7 = "8) Exit programmer";
  if (6 < uVar2) {
    pcVar7 = "8) Reboot FPGA and exit";
  }
  while (iVar4 - 0x3aU < 0xfffffff6) {
    if (iVar4 != 0) {
      poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar5 = std::operator<<(poVar5,"Invalid option -- try again");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"Board: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," (");
    BoardIO::GetHardwareVersionString_abi_cxx11_(&local_d8,(BoardIO *)Board);
    poVar5 = std::operator<<(poVar5,(string *)&local_d8);
    poVar5 = std::operator<<(poVar5,")");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_d8);
    if (sVar1 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"0) Exit programmer");
      std::endl<char,std::char_traits<char>>(poVar5);
      if (uVar3 == 0x44514c41) {
        poVar5 = std::operator<<((ostream *)&std::cout,"4) Program QLA 1 SN");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"5) Program QLA 2 SN");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"6) Read FPGA SN");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        pcVar6 = "7) Read QLA 1+2 SN";
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"5) Program QLA SN");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"6) Read FPGA SN");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        pcVar6 = "7) Read QLA SN";
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"MCS file: ");
      poVar5 = std::operator<<(poVar5,(string *)mcsName);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"PROM Id: ");
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      FpgaIO::PromGetId(&Board->super_FpgaIO);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"0) Exit programmer");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"1) Program PROM");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"2) Verify PROM");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"3) Read PROM data");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"4) Program FPGA SN");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"5) Program QLA SN");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"6) Read FPGA SN");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<(poVar5,"7) Read QLA SN");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = (ostream *)&std::cout;
      pcVar6 = "9) Download PROM to MCS file";
    }
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"Select option: ");
    iVar4 = getchar();
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  tcsetattr(0,0,&local_b4);
  return iVar4 + -0x30;
}

Assistant:

int GetMenuChoice(AmpIO &Board, const std::string &mcsName)
{
#ifndef _MSC_VER
    struct termios savedTerm, newTerm;
    tcgetattr(STDIN_FILENO, &savedTerm);
    newTerm = savedTerm;
    newTerm.c_lflag &= ~ICANON;  // turn off line buffering
    tcsetattr(STDIN_FILENO, TCSANOW, &newTerm);  // change terminal settings
#endif

    uint32_t fver = Board.GetFirmwareVersion();
    uint32_t hver = Board.GetHardwareVersion();
    bool fpgaV3 = mcsName.empty();
    int c = 0;
    while ((c < '0') || (c > '9')) {
        if (c) {
            std::cout << std::endl << "Invalid option -- try again" << std::endl;
        }
        std::cout << std::endl
                  << "Board: " << (unsigned int)Board.GetBoardId()
                  << " (" << Board.GetHardwareVersionString() << ")" << std::endl;
        if (!fpgaV3) {
            std::cout << "MCS file: " << mcsName << std::endl;
            std::cout << "PROM Id: " << std::hex << Board.PromGetId() << std::dec
                      << std::endl << std::endl;
        }

        std::cout << "0) Exit programmer" << std::endl;
        if (!fpgaV3) {
            std::cout << "1) Program PROM" << std::endl
                      << "2) Verify PROM" << std::endl
                      << "3) Read PROM data" << std::endl
                      << "4) Program FPGA SN" << std::endl
                      << "5) Program QLA SN" << std::endl
                      << "6) Read FPGA SN" << std::endl
                      << "7) Read QLA SN" << std::endl;
            if (fver >= 7)
                std::cout << "8) Reboot FPGA and exit" << std::endl;
            else
                std::cout << "8) Exit programmer" << std::endl;
            std::cout << "9) Download PROM to MCS file" << std::endl;
        }
        else {
            // With FPGA V3, we can only program or read the QLA PROM,
            // or read the FPGA S/N
            if (hver == DQLA_String) {
                std::cout << "4) Program QLA 1 SN" << std::endl
                          << "5) Program QLA 2 SN" << std::endl
                          << "6) Read FPGA SN" << std::endl
                          << "7) Read QLA 1+2 SN" << std::endl;
            }
            else {
                std::cout << "5) Program QLA SN" << std::endl
                          << "6) Read FPGA SN" << std::endl
                          << "7) Read QLA SN" << std::endl;
            }
        }
        std::cout << std::endl;

        std::cout << "Select option: ";
#ifdef _MSC_VER
        c = _getche();
#else
        c = getchar();
#endif
        std::cout << std::endl;
    }

#ifndef _MSC_VER
    tcsetattr(STDIN_FILENO, TCSANOW, &savedTerm);  // restore terminal settings
#endif
    return (c-'0');
}